

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.cpp
# Opt level: O0

tuple<std::unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>,_unsigned_int,_unsigned_int>
__thiscall sai::Document::GetThumbnail(Document *this)

{
  bool bVar1;
  uint32_t uVar2;
  VirtualFileEntry *pVVar3;
  pointer __first;
  unique_ptr<std::byte[],_std::default_delete<std::byte[]>_> extraout_RDX;
  unique_ptr<std::byte[],_std::default_delete<std::byte[]>_> extraout_RDX_00;
  _Head_base<0UL,_std::unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>,_false> _Var4;
  VirtualFileSystem *in_RSI;
  tuple<std::unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>,_unsigned_int,_unsigned_int>
  tVar5;
  int local_10c;
  int local_108 [2];
  tuple<std::nullptr_t,_int,_int> local_100;
  span<std::byte,_18446744073709551615UL> local_f0;
  unique_ptr<std::byte[],_std::default_delete<std::byte[]>_> local_e0;
  unique_ptr<std::byte[],_std::default_delete<std::byte[]>_> Pixels;
  size_t PixelCount;
  int local_c4;
  int local_c0 [2];
  tuple<std::nullptr_t,_int,_int> local_b8 [2];
  uint local_94;
  uint local_90;
  ThumbnailHeader Header;
  optional<sai::VirtualFileEntry> Thumbnail;
  Document *this_local;
  
  VirtualFileSystem::GetEntry((optional<sai::VirtualFileEntry> *)&Header.Height,in_RSI,"thumbnail");
  bVar1 = std::optional::operator_cast_to_bool((optional *)&Header.Height);
  if (bVar1) {
    pVVar3 = std::optional<sai::VirtualFileEntry>::operator->
                       ((optional<sai::VirtualFileEntry> *)&Header.Height);
    VirtualFileEntry::Read<unsigned_int>(pVVar3,&local_94);
    pVVar3 = std::optional<sai::VirtualFileEntry>::operator->
                       ((optional<sai::VirtualFileEntry> *)&Header.Height);
    VirtualFileEntry::Read<unsigned_int>(pVVar3,&local_90);
    pVVar3 = std::optional<sai::VirtualFileEntry>::operator->
                       ((optional<sai::VirtualFileEntry> *)&Header.Height);
    VirtualFileEntry::Read<unsigned_int>(pVVar3,&Header.Width);
    uVar2 = Tag<(std::endian)1234,5ul>((char (*) [5])"BM32");
    if (Header.Width == uVar2) {
      Pixels._M_t.super___uniq_ptr_impl<std::byte,_std::default_delete<std::byte[]>_>._M_t.
      super__Tuple_impl<0UL,_std::byte_*,_std::default_delete<std::byte[]>_>.
      super__Head_base<0UL,_std::byte_*,_false>._M_head_impl._0_4_ = local_90 * local_94;
      Pixels._M_t.super___uniq_ptr_impl<std::byte,_std::default_delete<std::byte[]>_>._M_t.
      super__Tuple_impl<0UL,_std::byte_*,_std::default_delete<std::byte[]>_>.
      super__Head_base<0UL,_std::byte_*,_false>._M_head_impl._4_4_ = 0;
      std::make_unique<std::byte[]>((size_t)&local_e0);
      pVVar3 = std::optional<sai::VirtualFileEntry>::operator->
                         ((optional<sai::VirtualFileEntry> *)&Header.Height);
      __first = std::unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>::get(&local_e0);
      std::span<std::byte,_18446744073709551615UL>::span<std::byte_*>
                (&local_f0,__first,
                 (long)Pixels._M_t.
                       super___uniq_ptr_impl<std::byte,_std::default_delete<std::byte[]>_>._M_t.
                       super__Tuple_impl<0UL,_std::byte_*,_std::default_delete<std::byte[]>_>.
                       super__Head_base<0UL,_std::byte_*,_false>._M_head_impl << 2);
      VirtualFileEntry::Read(pVVar3,local_f0);
      std::
      make_tuple<std::unique_ptr<std::byte[],std::default_delete<std::byte[]>>,unsigned_int&,unsigned_int&>
                ((unique_ptr<std::byte[],_std::default_delete<std::byte[]>_> *)this,
                 (uint *)&local_e0,&local_94);
      bVar1 = true;
      std::unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>::~unique_ptr(&local_e0);
    }
    else {
      local_c0[0] = 0;
      local_c0[1] = 0;
      local_c4 = 0;
      std::make_tuple<decltype(nullptr),int,int>((void **)local_b8,local_c0,&local_c4);
      std::
      tuple<std::unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>,_unsigned_int,_unsigned_int>
      ::tuple<std::nullptr_t,_int,_int,_true,_true>
                ((tuple<std::unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>,_unsigned_int,_unsigned_int>
                  *)this,local_b8);
      bVar1 = true;
    }
  }
  else {
    bVar1 = false;
  }
  std::optional<sai::VirtualFileEntry>::~optional((optional<sai::VirtualFileEntry> *)&Header.Height)
  ;
  _Var4._M_head_impl._M_t.super___uniq_ptr_impl<std::byte,_std::default_delete<std::byte[]>_>._M_t.
  super__Tuple_impl<0UL,_std::byte_*,_std::default_delete<std::byte[]>_>.
  super__Head_base<0UL,_std::byte_*,_false>._M_head_impl =
       (unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>)
       (unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>)
       extraout_RDX._M_t.super___uniq_ptr_impl<std::byte,_std::default_delete<std::byte[]>_>._M_t.
       super__Tuple_impl<0UL,_std::byte_*,_std::default_delete<std::byte[]>_>.
       super__Head_base<0UL,_std::byte_*,_false>._M_head_impl;
  if (!bVar1) {
    local_108[0] = 0;
    local_108[1] = 0;
    local_10c = 0;
    std::make_tuple<decltype(nullptr),int,int>((void **)&local_100,local_108,&local_10c);
    std::
    tuple<std::unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>,_unsigned_int,_unsigned_int>
    ::tuple<std::nullptr_t,_int,_int,_true,_true>
              ((tuple<std::unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>,_unsigned_int,_unsigned_int>
                *)this,&local_100);
    _Var4._M_head_impl._M_t.super___uniq_ptr_impl<std::byte,_std::default_delete<std::byte[]>_>._M_t
    .super__Tuple_impl<0UL,_std::byte_*,_std::default_delete<std::byte[]>_>.
    super__Head_base<0UL,_std::byte_*,_false>._M_head_impl =
         (unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>)
         (unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>)
         extraout_RDX_00._M_t.super___uniq_ptr_impl<std::byte,_std::default_delete<std::byte[]>_>.
         _M_t.super__Tuple_impl<0UL,_std::byte_*,_std::default_delete<std::byte[]>_>.
         super__Head_base<0UL,_std::byte_*,_false>._M_head_impl;
  }
  tVar5.
  super__Tuple_impl<0UL,_std::unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>,_unsigned_int,_unsigned_int>
  .super__Head_base<0UL,_std::unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>,_false>.
  _M_head_impl._M_t.super___uniq_ptr_impl<std::byte,_std::default_delete<std::byte[]>_>._M_t.
  super__Tuple_impl<0UL,_std::byte_*,_std::default_delete<std::byte[]>_>.
  super__Head_base<0UL,_std::byte_*,_false>._M_head_impl =
       _Var4._M_head_impl._M_t.super___uniq_ptr_impl<std::byte,_std::default_delete<std::byte[]>_>.
       _M_t.super__Tuple_impl<0UL,_std::byte_*,_std::default_delete<std::byte[]>_>.
       super__Head_base<0UL,_std::byte_*,_false>._M_head_impl;
  tVar5.
  super__Tuple_impl<0UL,_std::unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>,_unsigned_int,_unsigned_int>
  .super__Tuple_impl<1UL,_unsigned_int,_unsigned_int> =
       (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)this;
  return (tuple<std::unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>,_unsigned_int,_unsigned_int>
          )tVar5.
           super__Tuple_impl<0UL,_std::unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>,_unsigned_int,_unsigned_int>
  ;
}

Assistant:

std::tuple<std::unique_ptr<std::byte[]>, std::uint32_t, std::uint32_t> Document::GetThumbnail()
{
	if( std::optional<VirtualFileEntry> Thumbnail = GetEntry("thumbnail"); Thumbnail )
	{
		ThumbnailHeader Header;
		Thumbnail->Read(Header.Width);
		Thumbnail->Read(Header.Height);
		Thumbnail->Read(Header.Magic);

		if( Header.Magic != sai::Tag<std::endian::little>("BM32") )
		{
			return std::make_tuple(nullptr, 0, 0);
		}

		const std::size_t            PixelCount = Header.Height * Header.Width;
		std::unique_ptr<std::byte[]> Pixels
			= std::make_unique<std::byte[]>(PixelCount * sizeof(std::uint32_t));

		Thumbnail->Read({Pixels.get(), PixelCount * sizeof(std::uint32_t)});

#if 0
		//// BGRA to RGBA
		std::size_t i = 0;

		//// Simd speedup, four pixels at a time
		while( i < ((PixelCount * sizeof(std::uint32_t)) & ~0xF) )
		{
			const __m128i Swizzle
				= _mm_set_epi8(15, 12, 13, 14, 11, 8, 9, 10, 7, 4, 5, 6, 3, 0, 1, 2);

			__m128i QuadPixel = _mm_loadu_si128(reinterpret_cast<__m128i*>(&Pixels[i]));

			QuadPixel = _mm_shuffle_epi8(QuadPixel, Swizzle);

			_mm_store_si128(reinterpret_cast<__m128i*>(&Pixels[i]), QuadPixel);

			i += (sizeof(std::uint32_t) * 4);
		}

		for( ; i < PixelCount * sizeof(std::uint32_t); i += sizeof(std::uint32_t) )
		{
			std::swap<std::byte>(Pixels[i], Pixels[i + 2]);
		}
#endif

		return std::make_tuple(std::move(Pixels), Header.Width, Header.Height);
	}
	return std::make_tuple(nullptr, 0, 0);
}